

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O3

QStringList * QNetworkInformationPrivate::backendNames(void)

{
  __pointer_type pQVar1;
  QArrayData *pQVar2;
  QNetworkInformationBackendFactory **ppQVar3;
  long asize;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  long lVar7;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>::guard._q_value.
                 super___atomic_base<signed_char>._M_i) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::instance();
    bVar4 = initializeList();
    if (bVar4) {
      pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
               instance();
      if ((pTVar5->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0)
      {
        LOCK();
        bVar4 = (pTVar5->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
                (__pointer_type)0x0;
        if (bVar4) {
          (pTVar5->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
        }
        UNLOCK();
        if (!bVar4) goto LAB_001b4874;
      }
      else {
LAB_001b4874:
        QBasicMutex::lockInternal();
      }
      pTVar6 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
               instance();
      pQVar2 = &((pTVar6->factories).d.d)->super_QArrayData;
      ppQVar3 = (pTVar6->factories).d.ptr;
      asize = (pTVar6->factories).d.size;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      LOCK();
      pQVar1 = (pTVar5->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
      (pTVar5->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (pQVar1 != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(pTVar5);
      }
      (in_RDI->d).d = (Data *)0x0;
      (in_RDI->d).ptr = (QString *)0x0;
      (in_RDI->d).size = 0;
      QList<QString>::reserve(in_RDI,asize);
      if (asize != 0) {
        lVar7 = 0;
        do {
          (**(code **)(**(long **)((long)ppQVar3 + lVar7) + 0x60))(&local_50);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,&local_50);
          QList<QString>::end(in_RDI);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          lVar7 = lVar7 + 8;
        } while (asize << 3 != lVar7);
      }
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,8,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return in_RDI;
      }
      goto LAB_001b4983;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (QString *)0x0;
    (in_RDI->d).size = 0;
    return in_RDI;
  }
LAB_001b4983:
  __stack_chk_fail();
}

Assistant:

QStringList QNetworkInformationPrivate::backendNames()
{
    if (!dataHolder())
        return {};
    if (!initializeList())
        return {};

    QMutexLocker locker(&dataHolder->instanceMutex);
    const QList copy = dataHolder->factories;
    locker.unlock();

    QStringList result;
    result.reserve(copy.size());
    for (const auto *factory : copy)
        result << factory->name();
    return result;
}